

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void destroy_free<LRQFAstate>(void *temp)

{
  void *in_RDI;
  
  LRQFAstate::~LRQFAstate((LRQFAstate *)0x31da3e);
  free(in_RDI);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}